

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall
ON_Brep::RemoveNesting(ON_Brep *this,bool bExtractSingleSegments,bool bEdges,bool bTrimCurves)

{
  bool bVar1;
  bool bVar2;
  ON_PolyCurve *pOVar3;
  undefined3 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  if (CONCAT31(in_register_00000011,bEdges) != 0) {
    uVar6 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = uVar7;
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pOVar3 = ON_PolyCurve::Cast((ON_Object *)
                                  (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4]);
      if (pOVar3 == (ON_PolyCurve *)0x0) {
        uVar6 = (uint)uVar7;
      }
      else {
        bVar1 = ON_PolyCurve::RemoveNesting(pOVar3);
        uVar6 = (uint)(byte)(bVar1 | (byte)uVar7);
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar3);
        }
      }
      uVar7 = (ulong)uVar6;
    }
  }
  bVar1 = SUB81(uVar7,0);
  if (bTrimCurves) {
    uVar6 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    uVar4 = 0;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = uVar4;
    }
    for (; bVar1 = SUB81(uVar7,0), uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pOVar3 = ON_PolyCurve::Cast((ON_Object *)
                                  (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4]);
      if (pOVar3 == (ON_PolyCurve *)0x0) {
        uVar6 = (uint)uVar7;
      }
      else {
        bVar2 = ON_PolyCurve::RemoveNesting(pOVar3);
        uVar6 = (uint)(byte)(bVar2 | bVar1);
        if (bExtractSingleSegments) {
          ON_PolyCurve::Count(pOVar3);
        }
      }
      uVar7 = (ulong)uVar6;
    }
  }
  return bVar1;
}

Assistant:

bool ON_Brep::RemoveNesting(
        bool bExtractSingleSegments,
        bool bEdges, 
        bool bTrimCurves
        )
{
  bool rc = false;
  // TODO
  int i, count;
  ON_PolyCurve* polycurve;

  if ( bEdges )
  {
    count = m_C3.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C3[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update edge's proxy information
        }
      }
    }
  }

  if ( bTrimCurves )
  {
    count = m_C2.Count();
    for ( i = 0; i < count; i++ )
    {
      polycurve = ON_PolyCurve::Cast(m_C2[i]);
      if ( 0 != polycurve )
      {
        if ( polycurve->RemoveNesting() )
          rc = true;
        if ( bExtractSingleSegments && 1 == polycurve->Count() )
        {
          // TODO - extract segment and update trims's proxy information
        }
      }
    }
  }

  return rc;
}